

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-obj.c
# Opt level: O3

void refill_lamp(object *lamp,object *obj)

{
  loc grid;
  _Bool _Var1;
  short sVar2;
  object *obj_00;
  player_upkeep *ppVar3;
  uint32_t uVar4;
  _Bool none_left;
  object *used;
  _Bool local_21;
  object *local_20;
  
  sVar2 = obj->timeout;
  if (sVar2 == 0) {
    sVar2 = obj->pval;
  }
  lamp->timeout = lamp->timeout + sVar2;
  msg("You fuel your lamp.");
  if ((int)(uint)z_info->fuel_lamp <= (int)lamp->timeout) {
    lamp->timeout = z_info->fuel_lamp;
    msg("Your lamp is full.");
  }
  _Var1 = flag_has_dbg(obj->flags,5,0x14,"obj->flags","OF_TAKES_FUEL");
  if (!_Var1) {
    local_21 = false;
    _Var1 = object_is_carried(player,obj);
    if (_Var1) {
      local_20 = gear_object_for_use(player,obj,L'\x01',true,&local_21);
    }
    else {
      local_20 = floor_object_for_use(player,obj,L'\x01',true,&local_21);
    }
    if (local_20->known != (object *)0x0) {
      object_delete((chunk *)player->cave,(chunk *)0x0,&local_20->known);
    }
    object_delete((chunk *)cave,(chunk *)player->cave,&local_20);
    ppVar3 = player->upkeep;
    uVar4 = ppVar3->redraw;
    goto LAB_00132cee;
  }
  if (obj->number < 2) {
    obj->timeout = 0;
  }
  else {
    obj_00 = object_split(obj,L'\x01');
    obj_00->timeout = 0;
    local_20 = obj_00;
    _Var1 = object_is_carried(player,obj);
    if (_Var1) {
      _Var1 = inven_carry_okay(obj_00);
      if (_Var1) {
        inven_carry(player,obj_00,true,true);
        goto LAB_00132cce;
      }
    }
    grid.x = (player->grid).x;
    grid.y = (player->grid).y;
    drop_near((chunk *)cave,&local_20,L'\0',grid,false,true);
  }
LAB_00132cce:
  ppVar3 = player->upkeep;
  ppVar3->notice = ppVar3->notice | 1;
  uVar4 = ppVar3->redraw | 0x20000;
  ppVar3->redraw = uVar4;
LAB_00132cee:
  *(byte *)&ppVar3->update = (byte)ppVar3->update | 2;
  ppVar3->redraw = uVar4 | 0x40000;
  return;
}

Assistant:

static void refill_lamp(struct object *lamp, struct object *obj)
{
	/* Refuel */
	lamp->timeout += obj->timeout ? obj->timeout : obj->pval;

	/* Message */
	msg("You fuel your lamp.");

	/* Comment */
	if (lamp->timeout >= z_info->fuel_lamp) {
		lamp->timeout = z_info->fuel_lamp;
		msg("Your lamp is full.");
	}

	/* Refilled from a lantern */
	if (of_has(obj->flags, OF_TAKES_FUEL)) {
		/* Unstack if necessary */
		if (obj->number > 1) {
			/* Obtain a local object, split */
			struct object *used = object_split(obj, 1);

			/* Remove fuel */
			used->timeout = 0;

			/* Carry or drop */
			if (object_is_carried(player, obj) && inven_carry_okay(used))
				inven_carry(player, used, true, true);
			else
				drop_near(cave, &used, 0, player->grid, false, true);
		} else
			/* Empty a single lantern */
			obj->timeout = 0;

		/* Combine the pack (later) */
		player->upkeep->notice |= (PN_COMBINE);

		/* Redraw stuff */
		player->upkeep->redraw |= (PR_INVEN);
	} else { /* Refilled from a flask */
		struct object *used;
		bool none_left = false;

		/* Decrease the item from the pack or the floor */
		if (object_is_carried(player, obj)) {
			used = gear_object_for_use(player, obj, 1, true,
				&none_left);
		} else {
			used = floor_object_for_use(player, obj, 1, true,
				&none_left);
		}
		if (used->known)
			object_delete(player->cave, NULL, &used->known);
		object_delete(cave, player->cave, &used);
	}

	/* Recalculate torch */
	player->upkeep->update |= (PU_TORCH);

	/* Redraw stuff */
	player->upkeep->redraw |= (PR_EQUIP);
}